

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::emitCurve(SemanticParser *this,SP *shape)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _func_int **pp_Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  bool bVar8;
  int iVar9;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  float fVar10;
  SP SVar11;
  SP ours;
  string type;
  string basis;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  shared_ptr<pbrt::Material> local_b8;
  string local_a8;
  undefined1 local_88 [32];
  string local_68;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             &(in_RDX->_M_ptr->material).
              super___shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>);
  findOrCreateMaterial((SemanticParser *)local_88,(SP *)shape);
  std::make_shared<pbrt::Curve,std::shared_ptr<pbrt::Material>>(&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  peVar1 = in_RDX->_M_ptr;
  peVar2 = *(element_type **)&(peVar1->transform).atStart.l.vx;
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(peVar1->transform).atStart.l.vx.z;
  pp_Var4 = *(_func_int ***)&(peVar1->transform).atStart.l.vy.y;
  uVar5 = *(undefined8 *)&(peVar1->transform).atStart.l.vz;
  uVar6 = *(undefined8 *)&(peVar1->transform).atStart.p.y;
  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(((element_type *)
           ((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
           0x80))->super_Entity).super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
          super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(peVar1->transform).atStart.l.vz.z;
  (((element_type *)
   ((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x80))->
  cameras).
  super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = uVar6;
  (((element_type *)
   ((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x80))->
  super_Entity)._vptr_Entity = pp_Var4;
  (((element_type *)
   ((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x80))->
  super_Entity).super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
  super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar5;
  (((SP *)((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
          0x70))->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar2;
  (((SP *)((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
          0x70))->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       p_Var3;
  peVar1 = in_RDX->_M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_88 + 0x20),"type",(allocator<char> *)&local_a8);
  bVar8 = syntactic::ParamSet::hasParamString
                    (&(peVar1->super_Node).super_ParamSet,(string *)(local_88 + 0x20));
  if (bVar8) {
    peVar1 = in_RDX->_M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"type",&local_e1);
    syntactic::ParamSet::getParamString
              ((string *)local_88,&(peVar1->super_Node).super_ParamSet,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,"",(allocator<char> *)&local_e0);
  }
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_88,"cylinder");
  if (bVar8) {
    *(undefined1 *)
     ((long)&(((element_type *)
              ((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              + 0x80))->cameras).
             super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
             ._M_impl.super__Vector_impl_data + 8) = 0;
  }
  else {
    bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,"ribbon");
    if (bVar8) {
      *(undefined1 *)
       ((long)&(((element_type *)
                ((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + 0x80))->cameras).
               super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
               ._M_impl.super__Vector_impl_data + 8) = 2;
    }
    else {
      bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_88,"flat");
      if (bVar8) {
        *(undefined1 *)
         ((long)&(((element_type *)
                  ((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + 0x80))->cameras).
                 super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                 ._M_impl.super__Vector_impl_data + 8) = 1;
      }
      else {
        *(undefined1 *)
         ((long)&(((element_type *)
                  ((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + 0x80))->cameras).
                 super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                 ._M_impl.super__Vector_impl_data + 8) = 3;
      }
    }
  }
  peVar1 = in_RDX->_M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"basis",&local_e1);
  bVar8 = syntactic::ParamSet::hasParamString(&(peVar1->super_Node).super_ParamSet,&local_e0);
  if (bVar8) {
    peVar1 = in_RDX->_M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"basis",&local_b9);
    syntactic::ParamSet::getParamString
              ((string *)(local_88 + 0x20),&(peVar1->super_Node).super_ParamSet,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_88 + 0x20),"",(allocator<char> *)&local_a8);
  }
  std::__cxx11::string::~string((string *)&local_e0);
  bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_88 + 0x20),"bezier");
  if (bVar8) {
    *(undefined1 *)
     ((long)&(((element_type *)
              ((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              + 0x80))->cameras).
             super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
             ._M_impl.super__Vector_impl_data + 9) = 0;
  }
  else {
    bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_88 + 0x20),"bspline");
    if (bVar8) {
      *(undefined1 *)
       ((long)&(((element_type *)
                ((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + 0x80))->cameras).
               super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
               ._M_impl.super__Vector_impl_data + 9) = 1;
    }
    else {
      *(undefined1 *)
       ((long)&(((element_type *)
                ((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + 0x80))->cameras).
               super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
               ._M_impl.super__Vector_impl_data + 9) = 2;
    }
  }
  peVar1 = in_RDX->_M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"width",(allocator<char> *)&local_a8);
  bVar8 = syntactic::ParamSet::hasParam1f(&(peVar1->super_Node).super_ParamSet,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (bVar8) {
    peVar1 = in_RDX->_M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"width",(allocator<char> *)&local_a8);
    fVar10 = syntactic::ParamSet::getParam1f(&(peVar1->super_Node).super_ParamSet,&local_e0,0.0);
    *(float *)((long)&(((element_type *)
                       ((long)local_b8.
                              super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       + 0x80))->sampler).
                      super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
         fVar10;
    *(float *)&(((element_type *)
                ((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + 0x80))->sampler).
               super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = fVar10;
    std::__cxx11::string::~string((string *)&local_e0);
  }
  peVar1 = in_RDX->_M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"width0",(allocator<char> *)&local_a8);
  bVar8 = syntactic::ParamSet::hasParam1f(&(peVar1->super_Node).super_ParamSet,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (bVar8) {
    peVar1 = in_RDX->_M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"width0",(allocator<char> *)&local_a8);
    fVar10 = syntactic::ParamSet::getParam1f(&(peVar1->super_Node).super_ParamSet,&local_e0,0.0);
    *(float *)&(((element_type *)
                ((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + 0x80))->sampler).
               super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = fVar10;
    std::__cxx11::string::~string((string *)&local_e0);
  }
  peVar1 = in_RDX->_M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"width1",(allocator<char> *)&local_a8);
  bVar8 = syntactic::ParamSet::hasParam1f(&(peVar1->super_Node).super_ParamSet,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (bVar8) {
    peVar1 = in_RDX->_M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"width1",(allocator<char> *)&local_a8);
    fVar10 = syntactic::ParamSet::getParam1f(&(peVar1->super_Node).super_ParamSet,&local_e0,0.0);
    *(float *)((long)&(((element_type *)
                       ((long)local_b8.
                              super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       + 0x80))->sampler).
                      super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
         fVar10;
    std::__cxx11::string::~string((string *)&local_e0);
  }
  peVar1 = in_RDX->_M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"degree",(allocator<char> *)&local_a8);
  bVar8 = syntactic::ParamSet::hasParam1i(&(peVar1->super_Node).super_ParamSet,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (bVar8) {
    peVar1 = in_RDX->_M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"degree",(allocator<char> *)&local_a8);
    iVar9 = syntactic::ParamSet::getParam1i(&(peVar1->super_Node).super_ParamSet,&local_e0,0);
    *(char *)((long)&(((element_type *)
                      ((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + 0x80))->cameras).
                     super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                     ._M_impl.super__Vector_impl_data + 10) = (char)iVar9;
    std::__cxx11::string::~string((string *)&local_e0);
  }
  std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,in_RDX);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"P",&local_e1);
  extractVector<pbrt::math::vec3f>
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)&local_a8,
             (SemanticParser *)shape,(SP *)&local_48,&local_e0);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::_M_move_assign
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
             ((long)&(((element_type *)
                      ((long)local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + 0x80))->cameras).
                     super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                     ._M_impl.super__Vector_impl_data + 0x10),&local_a8);
  std::_Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::~_Vector_base
            ((_Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)&local_a8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  _Var7._M_pi = local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::~string((string *)local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  SVar11.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar11.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar11.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitCurve(pbrt::syntactic::Shape::SP shape)
  {
    Curve::SP ours = std::make_shared<Curve>(findOrCreateMaterial(shape->material));
    ours->transform = shape->transform.atStart;
    // -------------------------------------------------------
    // check 'type'
    // -------------------------------------------------------
    const std::string type
      = shape->hasParamString("type")
      ? shape->getParamString("type")
      : std::string("");
    if (type == "cylinder")
      ours->type = Curve::CurveType_Cylinder;
    else if (type == "ribbon")
      ours->type = Curve::CurveType_Ribbon;
    else if (type == "flat")
      ours->type = Curve::CurveType_Flat;
    else 
      ours->type = Curve::CurveType_Unknown;
        
    // -------------------------------------------------------
    // check 'basis'
    // -------------------------------------------------------
    const std::string basis
      = shape->hasParamString("basis")
      ? shape->getParamString("basis")
      : std::string("");
    if (basis == "bezier")
      ours->basis = Curve::CurveBasis_Bezier;
    else if (basis == "bspline")
      ours->basis = Curve::CurveBasis_BSpline;
    else 
      ours->basis = Curve::CurveBasis_Unknown;
        
    // -------------------------------------------------------
    // check 'width', 'width0', 'width1'
    // -------------------------------------------------------
    if (shape->hasParam1f("width")) 
      ours->width0 = ours->width1 = shape->getParam1f("width");
        
    if (shape->hasParam1f("width0")) 
      ours->width0 = shape->getParam1f("width0");
    if (shape->hasParam1f("width1")) 
      ours->width1 = shape->getParam1f("width1");

    if (shape->hasParam1i("degree")) 
      ours->degree = shape->getParam1i("degree");

    // -------------------------------------------------------
    // vertices - param "P", 3x float each
    // -------------------------------------------------------
    ours->P = extractVector<vec3f>(shape,"P");
    return ours;
  }